

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::memberQualifierCheck(TParseContext *this,TPublicType *publicType)

{
  bool bVar1;
  TPublicType *publicType_local;
  TParseContext *this_local;
  
  globalQualifierFixCheck(this,&publicType->loc,&publicType->qualifier,true,(TPublicType *)0x0);
  checkNoShaderLayouts(this,&publicType->loc,&publicType->shaderQualifiers);
  bVar1 = TQualifier::isNonUniform(&publicType->qualifier);
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,&publicType->loc,"not allowed on block or structure members","nonuniformEXT","")
    ;
    *(ulong *)&(publicType->qualifier).field_0x8 =
         *(ulong *)&(publicType->qualifier).field_0x8 & 0xfffffffdffffffff;
  }
  return;
}

Assistant:

void TParseContext::memberQualifierCheck(glslang::TPublicType& publicType)
{
    globalQualifierFixCheck(publicType.loc, publicType.qualifier, true);
    checkNoShaderLayouts(publicType.loc, publicType.shaderQualifiers);
    if (publicType.qualifier.isNonUniform()) {
        error(publicType.loc, "not allowed on block or structure members", "nonuniformEXT", "");
        publicType.qualifier.nonUniform = false;
    }
}